

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ompt-general.cpp
# Opt level: O3

ompt_set_result_t ompt_set_callback(ompt_callbacks_t which,ompt_callback_t callback)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  switch(which) {
  case ompt_callback_thread_begin:
    ompt_enabled = (ompt_callbacks_active_t)
                   (((ulong)ompt_enabled & 0xfffffffffffffffd) +
                   (ulong)(callback != (ompt_callback_t)0x0) * 2);
    ompt_callbacks.ompt_callback_thread_begin_callback = (ompt_callback_thread_begin_t)callback;
    return ompt_set_always;
  case ompt_callback_thread_end:
    ompt_enabled = (ompt_callbacks_active_t)
                   (((ulong)ompt_enabled & 0xfffffffffffffffb) +
                   (ulong)(callback != (ompt_callback_t)0x0) * 4);
    ompt_callbacks.ompt_callback_thread_end_callback = (ompt_callback_thread_end_t)callback;
    return ompt_set_always;
  case ompt_callback_parallel_begin:
    ompt_enabled = (ompt_callbacks_active_t)
                   (((ulong)ompt_enabled & 0xfffffffffffffff7) +
                   (ulong)(callback != (ompt_callback_t)0x0) * 8);
    ompt_callbacks.ompt_callback_parallel_begin_callback = (ompt_callback_parallel_begin_t)callback;
    return ompt_set_always;
  case ompt_callback_parallel_end:
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 4;
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffffef;
    ompt_callbacks.ompt_callback_parallel_end_callback = (ompt_callback_parallel_end_t)callback;
    break;
  case ompt_callback_task_create:
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 5;
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffffdf;
    ompt_callbacks.ompt_callback_task_create_callback = (ompt_callback_task_create_t)callback;
    break;
  case ompt_callback_task_schedule:
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 6;
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffffbf;
    ompt_callbacks.ompt_callback_task_schedule_callback = (ompt_callback_task_schedule_t)callback;
    break;
  case ompt_callback_implicit_task:
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffff7f;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 7;
    ompt_callbacks.ompt_callback_implicit_task_callback = (ompt_callback_implicit_task_t)callback;
    break;
  case ompt_callback_target:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffffeff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 8;
    ompt_callbacks.ompt_callback_target_callback = (ompt_callback_target_t)callback;
    goto LAB_00175535;
  case ompt_callback_target_data_op:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffffdff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 9;
    ompt_callbacks.ompt_callback_target_data_op_callback = (ompt_callback_target_data_op_t)callback;
    goto LAB_00175535;
  case ompt_callback_target_submit:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffffbff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 10;
    ompt_callbacks.ompt_callback_target_submit_callback = (ompt_callback_target_submit_t)callback;
    goto LAB_00175535;
  case ompt_callback_control_tool:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffff7ff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0xb;
    ompt_callbacks.ompt_callback_control_tool_callback = (ompt_callback_control_tool_t)callback;
    break;
  case ompt_callback_device_initialize:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffefff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0xc;
    ompt_callbacks.ompt_callback_device_initialize_callback =
         (ompt_callback_device_initialize_t)callback;
    goto LAB_00175535;
  case ompt_callback_device_finalize:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffdfff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0xd;
    ompt_callbacks.ompt_callback_device_finalize_callback =
         (ompt_callback_device_finalize_t)callback;
    goto LAB_00175535;
  case ompt_callback_device_load:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffffffffbfff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0xe;
    ompt_callbacks.ompt_callback_device_load_callback = (ompt_callback_device_load_t)callback;
    goto LAB_00175535;
  case ompt_callback_device_unload:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffffffff7fff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0xf;
    ompt_callbacks.ompt_callback_device_unload_callback = (ompt_callback_device_unload_t)callback;
    goto LAB_00175535;
  case ompt_callback_sync_region_wait:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffeffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x10;
    ompt_callbacks.ompt_callback_sync_region_wait_callback = (ompt_callback_sync_region_t)callback;
    break;
  case ompt_callback_mutex_released:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffdffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x11;
    ompt_callbacks.ompt_callback_mutex_released_callback = (ompt_callback_mutex_t)callback;
    break;
  case ompt_callback_dependences:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffffbffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x12;
    ompt_callbacks.ompt_callback_dependences_callback = (ompt_callback_dependences_t)callback;
    break;
  case ompt_callback_task_dependence:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffff7ffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x13;
    ompt_callbacks.ompt_callback_task_dependence_callback =
         (ompt_callback_task_dependence_t)callback;
    break;
  case ompt_callback_work:
    uVar3 = (ulong)ompt_enabled & 0xffffffffffefffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x14;
    ompt_callbacks.ompt_callback_work_callback = (ompt_callback_work_t)callback;
    break;
  case ompt_callback_master:
    uVar3 = (ulong)ompt_enabled & 0xffffffffffdfffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x15;
    ompt_callbacks.ompt_callback_master_callback = (ompt_callback_master_t)callback;
    break;
  case ompt_callback_target_map:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffffffbfffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x16;
    ompt_callbacks.ompt_callback_target_map_callback = (ompt_callback_target_map_t)callback;
    goto LAB_00175535;
  case ompt_callback_sync_region:
    uVar3 = (ulong)ompt_enabled & 0xffffffffff7fffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x17;
    ompt_callbacks.ompt_callback_sync_region_callback = (ompt_callback_sync_region_t)callback;
    break;
  case ompt_callback_lock_init:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffeffffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x18;
    ompt_callbacks.ompt_callback_lock_init_callback = (ompt_callback_mutex_acquire_t)callback;
    break;
  case ompt_callback_lock_destroy:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffdffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x19);
    ompt_callbacks.ompt_callback_lock_destroy_callback = (ompt_callback_mutex_t)callback;
    break;
  case ompt_callback_mutex_acquire:
    uVar3 = (ulong)ompt_enabled & 0xfffffffffbffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1a);
    ompt_callbacks.ompt_callback_mutex_acquire_callback = (ompt_callback_mutex_acquire_t)callback;
    break;
  case ompt_callback_mutex_acquired:
    uVar3 = (ulong)ompt_enabled & 0xfffffffff7ffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1b);
    ompt_callbacks.ompt_callback_mutex_acquired_callback = (ompt_callback_mutex_t)callback;
    break;
  case ompt_callback_nest_lock:
    uVar3 = (ulong)ompt_enabled & 0xffffffffefffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1c);
    ompt_callbacks.ompt_callback_nest_lock_callback = (ompt_callback_nest_lock_t)callback;
    break;
  case ompt_callback_flush:
    uVar3 = (ulong)ompt_enabled & 0xffffffffdfffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1d);
    ompt_callbacks.ompt_callback_flush_callback = (ompt_callback_flush_t)callback;
    break;
  case ompt_callback_cancel:
    uVar3 = (ulong)ompt_enabled & 0xffffffffbfffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1e);
    ompt_callbacks.ompt_callback_cancel_callback = (ompt_callback_cancel_t)callback;
    break;
  case ompt_callback_reduction:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xffffffff7fffffff;
    uVar1 = (ulong)((uint)(callback != (ompt_callback_t)0x0) << 0x1f);
    ompt_callbacks.ompt_callback_reduction_callback = (ompt_callback_sync_region_t)callback;
    goto LAB_00175535;
  case ompt_callback_dispatch:
    uVar2 = (uint)(callback == (ompt_callback_t)0x0);
    uVar3 = (ulong)ompt_enabled & 0xfffffffeffffffff;
    uVar1 = (ulong)(callback != (ompt_callback_t)0x0) << 0x20;
    ompt_callbacks.ompt_callback_dispatch_callback = (ompt_callback_dispatch_t)callback;
LAB_00175535:
    ompt_enabled = (ompt_callbacks_active_t)(uVar3 | uVar1);
    return uVar2 * 4 + ompt_set_never;
  default:
    return ompt_set_error;
  }
  ompt_enabled = (ompt_callbacks_active_t)(uVar3 | uVar1);
  return ompt_set_always;
}

Assistant:

OMPT_API_ROUTINE ompt_set_result_t ompt_set_callback(ompt_callbacks_t which,
                                       ompt_callback_t callback) {
  switch (which) {

#define ompt_event_macro(event_name, callback_type, event_id)                  \
  case event_name:                                                             \
    if (ompt_event_implementation_status(event_name)) {                        \
      ompt_callbacks.ompt_callback(event_name) = (callback_type)callback;      \
      ompt_enabled.event_name = (callback != 0);                               \
    }                                                                          \
    if (callback)                                                              \
      return ompt_event_implementation_status(event_name);                     \
    else                                                                       \
      return ompt_set_always;

    FOREACH_OMPT_EVENT(ompt_event_macro)

#undef ompt_event_macro

  default:
    return ompt_set_error;
  }
}